

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O3

void Fraig_TableResizeF(Fraig_HashTable_t *p,int fUseSimR)

{
  uint uVar1;
  Fraig_Node_t **ppFVar2;
  Fraig_Node_t *pFVar3;
  ulong uVar4;
  Fraig_Node_t *pFVar5;
  uint uVar6;
  Fraig_Node_t **ppFVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  timespec ts;
  timespec tStack_38;
  
  clock_gettime(3,&tStack_38);
  uVar1 = p->nBins;
  uVar9 = uVar1 * 2 - 1;
  while( true ) {
    do {
      uVar10 = uVar9 + 1;
      uVar6 = uVar9 & 1;
      uVar9 = uVar10;
    } while (uVar6 != 0);
    if (uVar10 < 9) break;
    iVar8 = 5;
    while (uVar10 % (iVar8 - 2U) != 0) {
      uVar6 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar10 < uVar6) goto LAB_005f35d5;
    }
  }
LAB_005f35d5:
  ppFVar7 = (Fraig_Node_t **)calloc(1,(long)(int)uVar10 << 3);
  if ((int)uVar1 < 1) {
    iVar8 = 0;
  }
  else {
    ppFVar2 = p->pBins;
    uVar11 = 0;
    iVar8 = 0;
    do {
      pFVar5 = ppFVar2[uVar11];
      while (pFVar5 != (Fraig_Node_t *)0x0) {
        pFVar3 = pFVar5->pNextF;
        uVar4 = (ulong)(&pFVar5->uHashR)[fUseSimR == 0] % (ulong)uVar10;
        pFVar5->pNextF = ppFVar7[uVar4];
        ppFVar7[uVar4] = pFVar5;
        iVar8 = iVar8 + 1;
        pFVar5 = pFVar3;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar1);
  }
  if (iVar8 == p->nEntries) {
    if (p->pBins != (Fraig_Node_t **)0x0) {
      free(p->pBins);
    }
    p->pBins = ppFVar7;
    p->nBins = uVar10;
    return;
  }
  __assert_fail("Counter == p->nEntries",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigTable.c"
                ,0x14a,"void Fraig_TableResizeF(Fraig_HashTable_t *, int)");
}

Assistant:

void Fraig_TableResizeF( Fraig_HashTable_t * p, int fUseSimR )
{
    Fraig_Node_t ** pBinsNew;
    Fraig_Node_t * pEnt, * pEnt2;
    int nBinsNew, Counter, i;
    abctime clk;
    unsigned Key;

clk = Abc_Clock();
    // get the new table size
    nBinsNew = Abc_PrimeCudd(2 * p->nBins); 
    // allocate a new array
    pBinsNew = ABC_ALLOC( Fraig_Node_t *, nBinsNew );
    memset( pBinsNew, 0, sizeof(Fraig_Node_t *) * nBinsNew );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < p->nBins; i++ )
        Fraig_TableBinForEachEntrySafeF( p->pBins[i], pEnt, pEnt2 )
        {
            if ( fUseSimR )
                Key = pEnt->uHashR % nBinsNew;
            else
                Key = pEnt->uHashD % nBinsNew;
            pEnt->pNextF = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == p->nEntries );
//    printf( "Increasing the functional table size from %6d to %6d. ", p->nBins, nBinsNew );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    // replace the table and the parameters
    ABC_FREE( p->pBins );
    p->pBins = pBinsNew;
    p->nBins = nBinsNew;
}